

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O0

void mbhit(monst *mon,int range,_func_int_monst_ptr_obj_ptr *fhitm,_func_int_obj_ptr_obj_ptr *fhito,
          obj *obj)

{
  short sVar1;
  boolean bVar2;
  byte bVar3;
  int iVar4;
  obj *poVar5;
  char *pcVar6;
  monst *local_68;
  obj *next_obj;
  int hitanything;
  int y;
  int x;
  int ddy;
  int ddx;
  uchar typ;
  obj *otmp;
  monst *mtmp;
  obj *obj_local;
  _func_int_obj_ptr_obj_ptr *fhito_local;
  _func_int_monst_ptr_obj_ptr *fhitm_local;
  monst *pmStack_10;
  int range_local;
  monst *mon_local;
  
  bhitpos.x = mon->mx;
  bhitpos.y = mon->my;
  mtmp = (monst *)obj;
  obj_local = (obj *)fhito;
  fhito_local = (_func_int_obj_ptr_obj_ptr *)fhitm;
  fhitm_local._4_4_ = range;
  pmStack_10 = mon;
  x = sgn((int)mon->mux - (int)mon->mx);
  y = sgn((int)pmStack_10->muy - (int)pmStack_10->my);
  do {
    if (fhitm_local._4_4_ < 1) {
      return;
    }
    bhitpos.x = bhitpos.x + (char)x;
    bhitpos.y = bhitpos.y + (char)y;
    hitanything = (int)bhitpos.x;
    next_obj._4_4_ = (int)bhitpos.y;
    if ((((hitanything < 1) || (0x4f < hitanything)) || (next_obj._4_4_ < 0)) ||
       (0x14 < next_obj._4_4_)) {
      bhitpos.x = bhitpos.x - (char)x;
      bhitpos.y = bhitpos.y - (char)y;
      return;
    }
    fhitm_local._4_4_ = fhitm_local._4_4_ + -1;
    bVar2 = find_drawbridge(&hitanything,(int *)((long)&next_obj + 4));
    if (((bVar2 != '\0') && (*(short *)((long)&mtmp->m_id + 2) == 0x1c4)) &&
       (level->locations[bhitpos.x][bhitpos.y].typ == '\f')) {
      destroy_drawbridge(hitanything,next_obj._4_4_);
      if (pmStack_10->wormno == '\0') {
        if ((viz_array[pmStack_10->my][pmStack_10->mx] & 2U) == 0) {
          if ((((((u.uprops[0x1e].intrinsic != 0) ||
                 ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
                (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
               ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
              ((u.uprops[0x40].intrinsic == 0 &&
               ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0)))))) ||
             ((pmStack_10->data->mflags3 & 0x200) == 0)) goto LAB_00263cce;
          bVar3 = viz_array[pmStack_10->my][pmStack_10->mx] & 1;
          goto joined_r0x00263c25;
        }
      }
      else {
        bVar3 = worm_known(level,pmStack_10);
joined_r0x00263c25:
        if (bVar3 == 0) goto LAB_00263cce;
      }
      if ((((((*(uint *)&pmStack_10->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0))
           || (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
         ((((*(uint *)&pmStack_10->field_0x60 >> 7 & 1) == 0 &&
           ((*(uint *)&pmStack_10->field_0x60 >> 9 & 1) == 0)) && (((byte)u._1052_1_ >> 5 & 1) == 0)
          ))) {
        discover_object((int)*(short *)((long)&mtmp->m_id + 2),'\x01','\x01');
      }
    }
LAB_00263cce:
    if ((bhitpos.x == u.ux) && (bhitpos.y == u.uy)) {
      (*fhito_local)((obj *)&youmonst,(obj *)mtmp);
      fhitm_local._4_4_ = fhitm_local._4_4_ + -3;
    }
    else if ((level->monsters[bhitpos.x][bhitpos.y] != (monst *)0x0) &&
            ((*(uint *)&level->monsters[bhitpos.x][bhitpos.y]->field_0x60 >> 9 & 1) == 0)) {
      if ((level->monsters[bhitpos.x][bhitpos.y] == (monst *)0x0) ||
         ((*(uint *)&level->monsters[bhitpos.x][bhitpos.y]->field_0x60 >> 9 & 1) != 0)) {
        local_68 = (monst *)0x0;
      }
      else {
        local_68 = level->monsters[bhitpos.x][bhitpos.y];
      }
      otmp = (obj *)local_68;
      if ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0) {
        if (local_68->wormno == '\0') {
          if ((viz_array[local_68->my][local_68->mx] & 2U) != 0) goto LAB_00263ff9;
          if (((((u.uprops[0x1e].intrinsic == 0) &&
                (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                 (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
               ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
              ((u.uprops[0x40].intrinsic != 0 ||
               ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))))) &&
             ((local_68->data->mflags3 & 0x200) != 0)) {
            bVar3 = viz_array[local_68->my][local_68->mx] & 1;
            goto joined_r0x00263ff3;
          }
        }
        else {
          bVar3 = worm_known(level,local_68);
joined_r0x00263ff3:
          if (bVar3 != 0) {
LAB_00263ff9:
            if (((((((uint)otmp->owornmask >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0))
               && (((((uint)otmp->owornmask >> 7 & 1) == 0 &&
                    (((uint)otmp->owornmask >> 9 & 1) == 0)) && (((byte)u._1052_1_ >> 5 & 1) == 0)))
               ) goto LAB_00264265;
          }
        }
        if (((((((otmp->v).v_nexthere)->quan & 0x10000U) != 0) ||
             ((poVar5 = which_armor((monst *)otmp,4), poVar5 != (obj *)0x0 &&
              (poVar5 = which_armor((monst *)otmp,4), poVar5->otyp == 0x4f)))) ||
            ((((u.uprops[0x1e].intrinsic == 0 &&
               (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
              (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
               (((((u.uprops[0x19].intrinsic == 0 &&
                   ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
                  (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)) ||
                (u.uprops[0x19].blocked != 0)))))) &&
             (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
              (iVar4 = dist2((int)(char)otmp->field_0x4f,(int)(char)otmp->corpsenm,(int)u.ux,
                             (int)u.uy), 0x40 < iVar4)))))) &&
           (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
            (bVar2 = match_warn_of_mon((monst *)otmp), bVar2 == '\0')))) {
          map_invisible(bhitpos.x,bhitpos.y);
        }
      }
LAB_00264265:
      (*fhito_local)(otmp,(obj *)mtmp);
      fhitm_local._4_4_ = fhitm_local._4_4_ + -3;
    }
    if (obj_local != (obj *)0x0) {
      next_obj._0_4_ = 0;
      _ddx = level->objects[bhitpos.x][bhitpos.y];
      while (_ddx != (obj *)0x0) {
        poVar5 = (_ddx->v).v_nexthere;
        iVar4 = (*(code *)obj_local)(_ddx,mtmp);
        next_obj._0_4_ = iVar4 + (int)next_obj;
        _ddx = poVar5;
      }
      if ((int)next_obj != 0) {
        fhitm_local._4_4_ = fhitm_local._4_4_ + -1;
      }
    }
    ddy._3_1_ = level->locations[bhitpos.x][bhitpos.y].typ;
    if ((((ddy._3_1_ == 0x17) || (ddy._3_1_ == 0xf)) &&
        ((sVar1 = *(short *)((long)&mtmp->m_id + 2), sVar1 == 0x1c4 ||
         (sVar1 == 0x1cc || sVar1 == 0x1cd)))) &&
       (bVar2 = doorlock((obj *)mtmp,(int)bhitpos.x,(int)bhitpos.y), bVar2 != '\0')) {
      if (pmStack_10->wormno == '\0') {
        if ((viz_array[pmStack_10->my][pmStack_10->mx] & 2U) != 0) goto LAB_00264506;
        if (((((u.uprops[0x1e].intrinsic == 0) &&
              (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
            ((u.uprops[0x40].intrinsic != 0 ||
             ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))))) &&
           ((pmStack_10->data->mflags3 & 0x200) != 0)) {
          bVar3 = viz_array[pmStack_10->my][pmStack_10->mx] & 1;
          goto joined_r0x00264500;
        }
      }
      else {
        bVar3 = worm_known(level,pmStack_10);
joined_r0x00264500:
        if (bVar3 != 0) {
LAB_00264506:
          if (((((((*(uint *)&pmStack_10->field_0x60 >> 1 & 1) == 0) ||
                 (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) ||
               (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
              (((*(uint *)&pmStack_10->field_0x60 >> 7 & 1) == 0 &&
               ((*(uint *)&pmStack_10->field_0x60 >> 9 & 1) == 0)))) &&
             (((byte)u._1052_1_ >> 5 & 1) == 0)) {
            discover_object((int)*(short *)((long)&mtmp->m_id + 2),'\x01','\x01');
          }
        }
      }
      if (((*(uint *)&level->locations[bhitpos.x][bhitpos.y].field_0x6 >> 4 & 0x1f) == 1) &&
         (pcVar6 = in_rooms(level,bhitpos.x,bhitpos.y,0x12), *pcVar6 != '\0')) {
        add_damage(bhitpos.x,bhitpos.y,0);
      }
    }
    if ((ddy._3_1_ < 0x11) ||
       ((ddy._3_1_ == 0x17 &&
        ((*(uint *)&level->locations[bhitpos.x][bhitpos.y].field_0x6 >> 4 & 0xc) != 0)))) {
      bhitpos.y = bhitpos.y - (char)y;
      bhitpos.x = bhitpos.x - (char)x;
      return;
    }
  } while( true );
}

Assistant:

static void mbhit(struct monst *mon,	/* monster shooting the wand */
		  int range,		/* direction and range */
		  int (*fhitm)(struct monst*,struct obj*),
		  int (*fhito)(struct obj*,struct obj*), /* fns called when mon/obj hit */
		  struct obj *obj)	/* 2nd arg to fhitm/fhito */
{
	struct monst *mtmp;
	struct obj *otmp;
	uchar typ;
	int ddx, ddy;

	bhitpos.x = mon->mx;
	bhitpos.y = mon->my;
	ddx = sgn(mon->mux - mon->mx);
	ddy = sgn(mon->muy - mon->my);

	while (range-- > 0) {
		int x,y;

		bhitpos.x += ddx;
		bhitpos.y += ddy;
		x = bhitpos.x; y = bhitpos.y;

		if (!isok(x,y)) {
		    bhitpos.x -= ddx;
		    bhitpos.y -= ddy;
		    break;
		}
		if (find_drawbridge(&x,&y)) {
		    switch (obj->otyp) {
			case WAN_STRIKING:
			    /* destroy closed drawbridges, not open ones */
			    if (level->locations[bhitpos.x][bhitpos.y].typ == DBWALL) {
				destroy_drawbridge(x,y);
				if (canseemon(level, mon))
				    makeknown(obj->otyp);
			    }
			    break;
		    }
		}
		if (bhitpos.x==u.ux && bhitpos.y==u.uy) {
			(*fhitm)(&youmonst, obj);
			range -= 3;
		} else if (MON_AT(level, bhitpos.x, bhitpos.y)){
			mtmp = m_at(level, bhitpos.x, bhitpos.y);
			if (cansee(bhitpos.x,bhitpos.y) && !canspotmon(level, mtmp))
			    map_invisible(bhitpos.x, bhitpos.y);
			(*fhitm)(mtmp, obj);
			range -= 3;
		}
		/* modified by GAN to hit all objects */
		if (fhito){
		    int hitanything = 0;
		    struct obj *next_obj;

		    for (otmp = level->objects[bhitpos.x][bhitpos.y];
							otmp; otmp = next_obj) {
			/* Fix for polymorph bug, Tim Wright */
			next_obj = otmp->nexthere;
			hitanything += (*fhito)(otmp, obj);
		    }
		    if (hitanything)	range--;
		}
		typ = level->locations[bhitpos.x][bhitpos.y].typ;
		if (IS_DOOR(typ) || typ == SDOOR) {
		    switch (obj->otyp) {
			/* note: monsters don't use opening or locking magic
			   at present, but keep these as placeholders */
			case WAN_OPENING:
			case WAN_LOCKING:
			case WAN_STRIKING:
			    if (doorlock(obj, bhitpos.x, bhitpos.y)) {
				if (canseemon(level, mon))
				    makeknown(obj->otyp);
				/* if a shop door gets broken, add it to
				   the shk's fix list (no cost to player) */
				if (level->locations[bhitpos.x][bhitpos.y].doormask ==
					D_BROKEN &&
				    *in_rooms(level, bhitpos.x, bhitpos.y, SHOPBASE))
				    add_damage(bhitpos.x, bhitpos.y, 0L);
			    }
			    break;
		    }
		}
		if (!ZAP_POS(typ) || (IS_DOOR(typ) &&
		   (level->locations[bhitpos.x][bhitpos.y].doormask & (D_LOCKED | D_CLOSED)))
		  ) {
			bhitpos.x -= ddx;
			bhitpos.y -= ddy;
			break;
		}
	}
}